

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  Module *__p_00;
  _Head_base<0UL,_wabt::Command_*,_false> _Var1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  TokenType TVar5;
  Enum EVar6;
  pointer __p;
  long lVar7;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  CommandPtr command;
  Module *local_90;
  _Head_base<0UL,_wabt::Command_*,_false> local_88 [2];
  Command local_78;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  __p_00 = local_90;
  MakeUnique<wabt::Module>();
  bVar2 = PeekMatchLpar(this,Module);
  if (bVar2) {
    local_88[0]._M_head_impl = (Command *)0x0;
    RVar3 = ParseModuleCommand(this,(Script *)0x0,(CommandPtr *)local_88);
    _Var1._M_head_impl = local_88[0]._M_head_impl;
    if (RVar3.enum_ != Error) {
      if ((local_88[0]._M_head_impl)->type != First) {
        __assert_fail("isa<Derived>(base.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                      ,0x67,
                      "std::unique_ptr<Derived> wabt::cast(std::unique_ptr<Base> &&) [Derived = wabt::ModuleCommand, Base = wabt::Command]"
                     );
      }
      local_88[0]._M_head_impl = (Command *)0x0;
      Module::operator=(local_90,(Module *)(_Var1._M_head_impl + 1));
      if (_Var1._M_head_impl != (Command *)0x0) {
        (*(_Var1._M_head_impl)->_vptr_Command[1])(_Var1._M_head_impl);
      }
    }
    if (local_88[0]._M_head_impl != (Command *)0x0) {
      (*(local_88[0]._M_head_impl)->_vptr_Command[1])();
    }
joined_r0x001669d2:
    EVar6 = Error;
    if (RVar3.enum_ == Error) goto LAB_00166ac8;
  }
  else {
    TVar4 = Peek(this,0);
    TVar5 = Peek(this,1);
    if (((TVar4 == Lpar) && (TVar5 < I8X16)) && ((0x150011ad400U >> ((ulong)TVar5 & 0x3f) & 1) != 0)
       ) {
      RVar3 = ParseModuleFieldList(this,local_90);
      goto joined_r0x001669d2;
    }
    Match(this,Lpar);
    local_88[0]._M_head_impl = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"a module field","");
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a module","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               (string *)local_88,&local_48);
    lVar7 = 0;
    ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    do {
      if (local_58 + lVar7 != *(undefined1 **)((long)local_68 + lVar7)) {
        operator_delete(*(undefined1 **)((long)local_68 + lVar7));
      }
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x40);
  }
  RVar3 = Expect(this,Eof);
  EVar6 = Error;
  if ((RVar3.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    local_90 = (Module *)0x0;
    std::__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>::reset
              ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> *)out_module,
               __p_00);
    EVar6 = Ok;
  }
LAB_00166ac8:
  if (local_90 != (Module *)0x0) {
    Module::~Module(local_90);
    operator_delete(local_90);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = MakeUnique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    auto module_command = cast<ModuleCommand>(std::move(command));
    *module = std::move(module_command->module);
  } else if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}